

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestTailCalleeImpl::foo(TestTailCalleeImpl *this,FooContext context)

{
  undefined4 uVar1;
  PromiseNode *extraout_RDX;
  Reader value;
  Promise<void> PVar2;
  Builder results;
  Reader params;
  Own<capnp::_::TestCallOrderImpl> OStack_b8;
  undefined1 local_a8 [24];
  CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_90;
  Builder local_88;
  Reader local_60;
  Maybe<capnp::MessageSize> local_30;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getParams(&local_60,&local_90);
  local_30.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getResults(&local_88,&local_90,&local_30);
  uVar1 = 0;
  if (0x1f < local_60._reader.dataSize) {
    uVar1 = *local_60._reader.data;
  }
  *(undefined4 *)local_88._builder.data = uVar1;
  value = capnproto_test::capnp::test::TestTailCallee::FooParams::Reader::getT(&local_60);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Builder::setT(&local_88,value);
  kj::heap<capnp::_::TestCallOrderImpl>();
  capnproto_test::capnp::test::TestCallOrder::Client::Client<capnp::_::TestCallOrderImpl,void>
            ((Client *)local_a8,&OStack_b8);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Builder::setC
            (&local_88,(Client *)local_a8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_a8 + 8));
  kj::Own<capnp::_::TestCallOrderImpl>::dispose(&OStack_b8);
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestTailCalleeImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto results = context.getResults();

  results.setI(params.getI());
  results.setT(params.getT());
  results.setC(kj::heap<TestCallOrderImpl>());

  return kj::READY_NOW;
}